

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O1

void __thiscall HostUI::set_palette(HostUI *this,RGBA *palette)

{
  uint uVar1;
  long lVar2;
  GLfloat p [16];
  GLfloat local_48;
  float local_44 [15];
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)((long)palette + lVar2);
    (&local_48)[lVar2] = (float)(uVar1 & 0xff) / 255.0;
    local_44[lVar2] = (float)(uVar1 >> 8 & 0xff) / 255.0;
    local_44[lVar2 + 1] = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
    local_44[lVar2 + 2] = 1.0;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  (*glUseProgram)(this->program);
  (*glUniform4fv)(this->uPalette,4,&local_48);
  return;
}

Assistant:

void HostUI::set_palette(RGBA palette[4]) {
  GLfloat p[16];
  for (int i = 0; i < 4; ++i) {
    p[i * 4 + 0] = ((palette[i] >> 0) & 255) / 255.0f;
    p[i * 4 + 1] = ((palette[i] >> 8) & 255) / 255.0f;
    p[i * 4 + 2] = ((palette[i] >> 16) & 255) / 255.0f;
    p[i * 4 + 3] = 1.0f;
  }
  glUseProgram(program);
  glUniform4fv(uPalette, 4, p);
}